

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_bool pi_next_rlcp(opj_pi_iterator_t *pi)

{
  opj_pi_resolution_t *poVar1;
  int iVar2;
  long index;
  opj_pi_resolution_t *res;
  opj_pi_comp_t *comp;
  opj_pi_iterator_t *pi_local;
  
  if (pi->first != 0) {
    pi->first = 0;
    pi->resno = (pi->poc).resno0;
    goto LAB_0014bd4b;
  }
  do {
    pi->precno = pi->precno + 1;
    while ((pi->poc).precno1 <= pi->precno) {
      do {
        pi->compno = pi->compno + 1;
        while ((pi->poc).compno1 <= (uint)pi->compno) {
          pi->layno = pi->layno + 1;
          while ((pi->poc).layno1 <= (uint)pi->layno) {
            pi->resno = pi->resno + 1;
LAB_0014bd4b:
            if ((pi->poc).resno1 <= (uint)pi->resno) {
              return 0;
            }
            pi->layno = (pi->poc).layno0;
          }
          pi->compno = (pi->poc).compno0;
        }
      } while (pi->comps[pi->compno].numresolutions <= pi->resno);
      poVar1 = pi->comps[pi->compno].resolutions;
      if (pi->tp_on == '\0') {
        (pi->poc).precno1 = poVar1[pi->resno].pw * poVar1[pi->resno].ph;
      }
      pi->precno = (pi->poc).precno0;
    }
    iVar2 = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno * pi->step_c +
            pi->precno * pi->step_p;
    if (pi->include[iVar2] == 0) {
      pi->include[iVar2] = 1;
      return 1;
    }
  } while( true );
}

Assistant:

static opj_bool pi_next_rlcp(opj_pi_iterator_t * pi) {
	opj_pi_comp_t *comp = NULL;
	opj_pi_resolution_t *res = NULL;
	long index = 0;

	if (!pi->first) {
		comp = &pi->comps[pi->compno];
		res = &comp->resolutions[pi->resno];
		goto LABEL_SKIP;
	} else {
		pi->first = 0;
	}

	for (pi->resno = pi->poc.resno0; pi->resno < pi->poc.resno1; pi->resno++) {
		for (pi->layno = pi->poc.layno0; pi->layno < pi->poc.layno1; pi->layno++) {
			for (pi->compno = pi->poc.compno0; pi->compno < pi->poc.compno1; pi->compno++) {
				comp = &pi->comps[pi->compno];
				if (pi->resno >= comp->numresolutions) {
					continue;
				}
				res = &comp->resolutions[pi->resno];
				if(!pi->tp_on){
					pi->poc.precno1 = res->pw * res->ph;
				}
				for (pi->precno = pi->poc.precno0; pi->precno < pi->poc.precno1; pi->precno++) {
					index = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno * pi->step_c + pi->precno * pi->step_p;
					if (!pi->include[index]) {
						pi->include[index] = 1;
						return OPJ_TRUE;
					}
LABEL_SKIP:;
				}
			}
		}
	}
	
	return OPJ_FALSE;
}